

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

bool FileCommit(FILE *file)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  undefined8 in_stack_ffffffffffffffc8;
  int err;
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  err = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = fflush((FILE *)file);
  if (iVar2 == 0) {
    iVar2 = fileno((FILE *)file);
    iVar2 = fdatasync(iVar2);
    bVar4 = true;
    if (iVar2 == 0) goto LAB_0061eaaf;
    piVar3 = __errno_location();
    if (*piVar3 == 0x16) goto LAB_0061eaaf;
    SysErrorString_abi_cxx11_(err);
    logging_function_00._M_str = "FileCommit";
    logging_function_00._M_len = 10;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
    ;
    source_file_00._M_len = 0x5c;
    LogPrintf_<std::__cxx11::string>
              (logging_function_00,source_file_00,0x7f,
               I2P|VALIDATION|LEVELDB|LIBEVENT|MEMPOOLREJ|PROXY|ESTIMATEFEE|RPC|WALLETDB|ZMQ|TOR|NET
               ,(Level)&stack0xffffffffffffffd0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8)
    ;
  }
  else {
    __errno_location();
    SysErrorString_abi_cxx11_(err);
    logging_function._M_str = "FileCommit";
    logging_function._M_len = 10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/util/fs_helpers.cpp"
    ;
    source_file._M_len = 0x5c;
    LogPrintf_<std::__cxx11::string>
              (logging_function,source_file,0x6f,
               I2P|VALIDATION|LEVELDB|LIBEVENT|MEMPOOLREJ|PROXY|ESTIMATEFEE|RPC|WALLETDB|BENCH,
               (Level)&stack0xffffffffffffffd0,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  bVar4 = false;
LAB_0061eaaf:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool FileCommit(FILE* file)
{
    if (fflush(file) != 0) { // harmless if redundantly called
        LogPrintf("fflush failed: %s\n", SysErrorString(errno));
        return false;
    }
#ifdef WIN32
    HANDLE hFile = (HANDLE)_get_osfhandle(_fileno(file));
    if (FlushFileBuffers(hFile) == 0) {
        LogPrintf("FlushFileBuffers failed: %s\n", Win32ErrorString(GetLastError()));
        return false;
    }
#elif defined(MAC_OSX) && defined(F_FULLFSYNC)
    if (fcntl(fileno(file), F_FULLFSYNC, 0) == -1) { // Manpage says "value other than -1" is returned on success
        LogPrintf("fcntl F_FULLFSYNC failed: %s\n", SysErrorString(errno));
        return false;
    }
#elif HAVE_FDATASYNC
    if (fdatasync(fileno(file)) != 0 && errno != EINVAL) { // Ignore EINVAL for filesystems that don't support sync
        LogPrintf("fdatasync failed: %s\n", SysErrorString(errno));
        return false;
    }
#else
    if (fsync(fileno(file)) != 0 && errno != EINVAL) {
        LogPrintf("fsync failed: %s\n", SysErrorString(errno));
        return false;
    }
#endif
    return true;
}